

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_wnaf(void)

{
  int iVar1;
  secp256k1_scalar n;
  secp256k1_scalar *in_stack_00000020;
  int i;
  int in_stack_0000045c;
  secp256k1_scalar *in_stack_00000460;
  int in_stack_0000046c;
  secp256k1_scalar *in_stack_00000470;
  int in_stack_0000049c;
  secp256k1_scalar *in_stack_000004a0;
  uint64_t local_28 [2];
  secp256k1_scalar *a;
  secp256k1_scalar *r;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  memset(local_28,0,0x20);
  test_constant_wnaf(in_stack_000004a0,in_stack_0000049c);
  local_28[0] = 1;
  test_constant_wnaf(in_stack_000004a0,in_stack_0000049c);
  local_28[0] = 2;
  test_constant_wnaf(in_stack_000004a0,in_stack_0000049c);
  local_28[0] = 1;
  local_28[1] = 0;
  a = (secp256k1_scalar *)0;
  r = (secp256k1_scalar *)0;
  secp256k1_scalar_negate((secp256k1_scalar *)0,(secp256k1_scalar *)0);
  test_constant_wnaf(in_stack_000004a0,in_stack_0000049c);
  secp256k1_scalar_add
            ((secp256k1_scalar *)n.d[2],(secp256k1_scalar *)n.d[1],(secp256k1_scalar *)n.d[0]);
  secp256k1_scalar_negate(r,a);
  test_constant_wnaf(in_stack_000004a0,in_stack_0000049c);
  secp256k1_scalar_inverse
            ((secp256k1_scalar *)n.d[0],
             (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  test_constant_wnaf(in_stack_000004a0,in_stack_0000049c);
  secp256k1_scalar_add
            ((secp256k1_scalar *)n.d[2],(secp256k1_scalar *)n.d[1],(secp256k1_scalar *)n.d[0]);
  test_constant_wnaf(in_stack_000004a0,in_stack_0000049c);
  test_fixed_wnaf_small();
  for (iVar2 = 0; iVar2 < COUNT; iVar2 = iVar2 + 1) {
    random_scalar_order((secp256k1_scalar *)n.d[0]);
    test_wnaf(in_stack_00000460,in_stack_0000045c);
    test_constant_wnaf_negate(in_stack_00000020);
    test_constant_wnaf(in_stack_000004a0,in_stack_0000049c);
    test_fixed_wnaf(in_stack_00000470,in_stack_0000046c);
  }
  secp256k1_scalar_set_int((secp256k1_scalar *)local_28,0);
  iVar1 = secp256k1_scalar_cond_negate((secp256k1_scalar *)n.d[0],iVar2);
  if (iVar1 != -1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x15f0,"test condition failed: secp256k1_scalar_cond_negate(&n, 1) == -1");
    abort();
  }
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)local_28);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x15f1,"test condition failed: secp256k1_scalar_is_zero(&n)");
    abort();
  }
  iVar2 = secp256k1_scalar_cond_negate((secp256k1_scalar *)n.d[0],iVar2);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x15f2,"test condition failed: secp256k1_scalar_cond_negate(&n, 0) == 1");
    abort();
  }
  iVar2 = secp256k1_scalar_is_zero((secp256k1_scalar *)local_28);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x15f3,"test condition failed: secp256k1_scalar_is_zero(&n)");
    abort();
  }
  return;
}

Assistant:

static void run_wnaf(void) {
    int i;
    secp256k1_scalar n = {{0}};

    test_constant_wnaf(&n, 4);
    /* Sanity check: 1 and 2 are the smallest odd and even numbers and should
     *               have easier-to-diagnose failure modes  */
    n.d[0] = 1;
    test_constant_wnaf(&n, 4);
    n.d[0] = 2;
    test_constant_wnaf(&n, 4);
    /* Test -1, because it's a special case in wnaf_const */
    n = secp256k1_scalar_one;
    secp256k1_scalar_negate(&n, &n);
    test_constant_wnaf(&n, 4);

    /* Test -2, which may not lead to overflows in wnaf_const */
    secp256k1_scalar_add(&n, &secp256k1_scalar_one, &secp256k1_scalar_one);
    secp256k1_scalar_negate(&n, &n);
    test_constant_wnaf(&n, 4);

    /* Test (1/2) - 1 = 1/-2 and 1/2 = (1/-2) + 1
       as corner cases of negation handling in wnaf_const */
    secp256k1_scalar_inverse(&n, &n);
    test_constant_wnaf(&n, 4);

    secp256k1_scalar_add(&n, &n, &secp256k1_scalar_one);
    test_constant_wnaf(&n, 4);

    /* Test 0 for fixed wnaf */
    test_fixed_wnaf_small();
    /* Random tests */
    for (i = 0; i < COUNT; i++) {
        random_scalar_order(&n);
        test_wnaf(&n, 4+(i%10));
        test_constant_wnaf_negate(&n);
        test_constant_wnaf(&n, 4 + (i % 10));
        test_fixed_wnaf(&n, 4 + (i % 10));
    }
    secp256k1_scalar_set_int(&n, 0);
    CHECK(secp256k1_scalar_cond_negate(&n, 1) == -1);
    CHECK(secp256k1_scalar_is_zero(&n));
    CHECK(secp256k1_scalar_cond_negate(&n, 0) == 1);
    CHECK(secp256k1_scalar_is_zero(&n));
}